

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

int __thiscall
phmap::priv::
base_checker<phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
::verify(base_checker<phmap::btree_set<int,_phmap::Less<int>,_std::allocator<int>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>
         *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  _Rb_tree_header *p_Var1;
  int extraout_EAX;
  int extraout_EAX_00;
  reference piVar2;
  long lVar3;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar4;
  int iVar5;
  char *pcVar6;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
  tree_iter;
  const_iterator cVar7;
  AssertionResult AVar8;
  AssertionResult gtest_ar_3;
  const_reverse_iterator tree_riter;
  AssertionResult gtest_ar;
  reverse_iterator checker_riter;
  iterator checker_iter;
  undefined1 local_b0 [8];
  int local_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [8];
  int iStack_98;
  undefined4 uStack_94;
  reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
  local_90;
  undefined1 local_80 [8];
  int local_78;
  undefined4 uStack_74;
  AssertHelper local_70;
  _Rb_tree_const_iterator<int> local_68;
  _Rb_tree_const_iterator<int> local_60;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *local_58;
  _Rb_tree_node_base *local_50;
  reverse_iterator<std::_Rb_tree_const_iterator<int>_> local_48;
  undefined8 uStack_40;
  
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::verify
            ((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              *)this,ctx,sig,siglen,tbs,tbslen);
  local_a0 = (undefined1  [8])
             (this->tree_).
             super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             .
             super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
             .tree_.size_;
  local_b0 = (undefined1  [8])(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_80,"tree_.size()","checker_.size()",(unsigned_long *)local_a0,
             (unsigned_long *)local_b0);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if ((undefined8 *)CONCAT44(uStack_74,local_78) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_74,local_78);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x112,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_74,local_78) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_74,local_78));
  }
  local_60._M_node = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 *)this);
  local_80[0] = cVar7.node._0_1_;
  local_80._1_7_ = cVar7.node._1_7_;
  local_78 = cVar7.position;
  cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
               *)this);
  pbVar4 = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            *)CONCAT71(local_80._1_7_,local_80[0]);
  if (local_78 != cVar7.position || pbVar4 != cVar7.node) {
    do {
      if (((ulong)pbVar4 & 7) != 0) {
        __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xf84,
                      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                     );
      }
      if (*(_Rb_tree_color *)(pbVar4 + (long)local_78 * 4 + 0xc) != local_60._M_node[1]._M_color)
      goto LAB_001e67a5;
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::increment((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                   *)local_80);
      local_60._M_node = (_Base_ptr)std::_Rb_tree_increment(local_60._M_node);
      cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                     *)this);
      pbVar4 = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                *)CONCAT71(local_80._1_7_,local_80[0]);
    } while (local_78 != cVar7.position || pbVar4 != cVar7.node);
  }
  iVar5 = (int)(this->tree_).
               super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
               .tree_.size_;
  if (0 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      tree_iter.node._1_7_ = local_80._1_7_;
      tree_iter.node._0_1_ = local_80[0];
      tree_iter.position = local_78;
      tree_iter._12_4_ = 0;
      base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
      ::
      iter_check<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>,std::_Rb_tree_const_iterator<int>>
                ((base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
                  *)this,tree_iter,local_60);
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::decrement((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                   *)local_80);
      local_60._M_node = (_Base_ptr)std::_Rb_tree_decrement(local_60._M_node);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 *)this);
  local_b0 = (undefined1  [8])cVar7.node;
  local_a8 = cVar7.position;
  testing::internal::
  CmpHelperEQ<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>>
            ((internal *)local_a0,"tree_iter","tree_.begin()",
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
              *)local_80,
             (btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
              *)local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,iStack_98) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_94,iStack_98);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x121,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,iStack_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,iStack_98));
  }
  local_b0 = (undefined1  [8])(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  testing::internal::
  CmpHelperEQ<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
            ((internal *)local_a0,"checker_iter","checker_.begin()",&local_60,
             (_Rb_tree_const_iterator<int> *)local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,iStack_98) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_94,iStack_98);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x122,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,iStack_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&iStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,iStack_98));
  }
  p_Var1 = &(this->checker_)._M_t._M_impl.super__Rb_tree_header;
  local_68._M_node = &p_Var1->_M_header;
  cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
               *)this);
  local_a0 = (undefined1  [8])cVar7.node;
  iStack_98 = cVar7.position;
  cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                 *)this);
  if ((local_a0 != (undefined1  [8])cVar7.node) || (iStack_98 != cVar7.position)) {
    do {
      piVar2 = std::
               reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
               ::operator*((reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
                            *)local_a0);
      lVar3 = std::_Rb_tree_decrement(local_68._M_node);
      if (*piVar2 != *(int *)(lVar3 + 0x20)) {
LAB_001e67a5:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                      ,0x49,
                      "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = int, U = int]"
                     );
      }
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::decrement((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                   *)local_a0);
      local_68._M_node = (_Base_ptr)std::_Rb_tree_decrement(local_68._M_node);
      cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              ::begin((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
    } while ((local_a0 != (undefined1  [8])cVar7.node) || (iStack_98 != cVar7.position));
  }
  iVar5 = (int)(this->tree_).
               super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_>
               .tree_.size_;
  local_58 = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
              *)p_Var1;
  if (0 < iVar5) {
    iVar5 = iVar5 + 1;
    do {
      uStack_40 = CONCAT44(uStack_94,iStack_98);
      local_48.current._M_node =
           (_Rb_tree_const_iterator<int>)(_Rb_tree_const_iterator<int>)local_a0;
      local_50 = local_68._M_node;
      base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
      ::
      riter_check<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>>,std::reverse_iterator<std::_Rb_tree_const_iterator<int>>>
                ((base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
                  *)local_b0,
                 (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
                  *)this,&local_48);
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::increment((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                   *)local_a0);
      local_68._M_node = (_Base_ptr)std::_Rb_tree_increment(local_68._M_node);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  cVar7 = btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
          end((btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
               *)this);
  local_90.current.node = cVar7.node;
  local_90.current.position = cVar7.position;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>>,std::reverse_iterator<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>const,int_const&,int_const*>>>
            ((internal *)local_b0,"tree_riter","tree_.rbegin()",
             (reverse_iterator<phmap::priv::btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>_>
              *)local_a0,&local_90);
  pbVar4 = local_58;
  if (local_b0[0] ==
      (base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
       )0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)CONCAT44(uStack_a4,local_a8) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_a4,local_a8);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x131,pcVar6);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_90.current.node !=
        (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
         *)0x0) {
      (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_a4,local_a8) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_a4,local_a8));
  }
  local_90.current.node = pbVar4;
  AVar8 = testing::internal::
          CmpHelperEQ<std::reverse_iterator<std::_Rb_tree_const_iterator<int>>,std::reverse_iterator<std::_Rb_tree_const_iterator<int>>>
                    ((internal *)local_b0,"checker_riter","checker_.rbegin()",
                     (reverse_iterator<std::_Rb_tree_const_iterator<int>_> *)&local_68,
                     (reverse_iterator<std::_Rb_tree_const_iterator<int>_> *)&local_90);
  iVar5 = AVar8._0_4_;
  if (local_b0[0] ==
      (base_checker<phmap::btree_set<int,phmap::Less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>>
       )0x0) {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)CONCAT44(uStack_a4,local_a8) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(uStack_a4,local_a8);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x132,pcVar6);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    iVar5 = extraout_EAX;
    if (local_90.current.node !=
        (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
         *)0x0) {
      iVar5 = (**(code **)(*(long *)local_90.current.node + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_a4,local_a8) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_a4,local_a8));
    iVar5 = extraout_EAX_00;
  }
  return iVar5;
}

Assistant:

void verify() const {
        tree_.verify();
        EXPECT_EQ(tree_.size(), checker_.size());

        // Move through the forward iterators using increment.
        auto checker_iter = checker_.begin();
        const_iterator tree_iter(tree_.begin());
        for (; tree_iter != tree_.end(); ++tree_iter, ++checker_iter) {
            CheckPairEquals(*tree_iter, *checker_iter);
        }

        // Move through the forward iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            iter_check(tree_iter, checker_iter);
            --tree_iter;
            --checker_iter;
        }
        EXPECT_EQ(tree_iter, tree_.begin());
        EXPECT_EQ(checker_iter, checker_.begin());

        // Move through the reverse iterators using increment.
        auto checker_riter = checker_.rbegin();
        const_reverse_iterator tree_riter(tree_.rbegin());
        for (; tree_riter != tree_.rend(); ++tree_riter, ++checker_riter) {
            CheckPairEquals(*tree_riter, *checker_riter);
        }

        // Move through the reverse iterators using decrement.
        for (int n = (int)tree_.size() - 1; n >= 0; --n) {
            riter_check(tree_riter, checker_riter);
            --tree_riter;
            --checker_riter;
        }
        EXPECT_EQ(tree_riter, tree_.rbegin());
        EXPECT_EQ(checker_riter, checker_.rbegin());
    }